

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int CmdCommandAlias(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *value;
  char *key;
  Abc_Alias *local_28;
  char *local_20;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (argc == 2) {
      iVar1 = st__lookup(pAbc->tAliases,argv[1],(char **)&local_28);
      iVar2 = 0;
      if (iVar1 != 0) {
        CmdCommandAliasPrint(pAbc,local_28);
      }
    }
    else {
      if (argc == 1) {
        CmdPrintTable(pAbc->tAliases,1);
      }
      else {
        local_20 = argv[1];
        iVar1 = st__delete(pAbc->tAliases,&local_20,(char **)&local_28);
        if (iVar1 != 0) {
          CmdCommandAliasFree(local_28);
        }
        CmdCommandAliasAdd(pAbc,argv[1],argc + -2,argv + 2);
      }
      iVar2 = 0;
    }
  }
  else {
    fwrite("usage: alias [-h] [command [string]]\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("   -h \t\tprint the command usage\n",0x20,1,(FILE *)pAbc->Err);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CmdCommandAlias( Abc_Frame_t * pAbc, int argc, char **argv )
{
    const char *key;
    char *value;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }


    if ( argc == 1 )
    {
        CmdPrintTable( pAbc->tAliases, 1 );
        return 0;

    }
    else if ( argc == 2 )
    {
        if ( st__lookup( pAbc->tAliases, argv[1], &value ) )
            CmdCommandAliasPrint( pAbc, ( Abc_Alias * ) value );
        return 0;
    }

    // delete any existing alias
    key = argv[1];
    if ( st__delete( pAbc->tAliases, &key, &value ) )
        CmdCommandAliasFree( ( Abc_Alias * ) value );
    CmdCommandAliasAdd( pAbc, argv[1], argc - 2, argv + 2 );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: alias [-h] [command [string]]\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return ( 1 );
}